

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnSetLocalExpr(BinaryReaderIR *this,Index param_1)

{
  Result RVar1;
  Location local_a0;
  Var local_80;
  _Head_base<0UL,_wabt::Expr_*,_false> local_38;
  Expr *local_30;
  
  GetLocation(&local_a0,this);
  Var::Var(&local_80,param_1,&local_a0);
  MakeUnique<wabt::VarExpr<(wabt::ExprType)36>,wabt::Var>((wabt *)&local_30,&local_80);
  local_38._M_head_impl = local_30;
  local_30 = (Expr *)0x0;
  RVar1 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_38);
  if (local_38._M_head_impl != (Expr *)0x0) {
    (*(local_38._M_head_impl)->_vptr_Expr[1])();
  }
  if (local_30 != (Expr *)0x0) {
    (**(code **)(*(long *)local_30 + 8))();
  }
  local_30 = (Expr *)0x0;
  Var::~Var(&local_80);
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnSetLocalExpr(Index local_index) {
  return AppendExpr(MakeUnique<SetLocalExpr>(Var(local_index, GetLocation())));
}